

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O0

void fe_warp_print(melfb_t *mel,char *label)

{
  char *label_local;
  melfb_t *mel_local;
  
  if (mel->warp_id < 3) {
    (*fe_warp_conf[mel->warp_id].print)(label);
    return;
  }
  if (mel->warp_id == 0xffffffff) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
            ,0xf5,"fe_warp module must be configured w/ a valid ID\n");
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
          ,0xfa,"fe_warp module misconfigured with invalid fe_warp_id %u\n",(ulong)mel->warp_id);
  exit(1);
}

Assistant:

void
fe_warp_print(melfb_t *mel, const char *label)
{
    if (mel->warp_id <= FE_WARP_ID_MAX) {
        fe_warp_conf[mel->warp_id].print(label);
    }
    else if (mel->warp_id == FE_WARP_ID_NONE) {
        E_FATAL("fe_warp module must be configured w/ a valid ID\n");
    }
    else {
        E_FATAL
            ("fe_warp module misconfigured with invalid fe_warp_id %u\n",
             mel->warp_id);
    }
}